

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::TracingServiceImpl::UpdateDataSource
          (TracingServiceImpl *this,ProducerID producer_id,DataSourceDescriptor *new_desc)

{
  bool bVar1;
  uint64_t uVar2;
  char *pcVar3;
  string *__x;
  pointer ppVar4;
  uint64_t uVar5;
  undefined8 uVar6;
  _Self local_40;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_perfetto::TracingServiceImpl::RegisteredDataSource>_>
  it;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_perfetto::TracingServiceImpl::RegisteredDataSource>_>,_std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_perfetto::TracingServiceImpl::RegisteredDataSource>_>_>
  range;
  RegisteredDataSource *data_source;
  DataSourceDescriptor *new_desc_local;
  ProducerID producer_id_local;
  TracingServiceImpl *this_local;
  
  uVar2 = protos::gen::DataSourceDescriptor::id(new_desc);
  if (uVar2 == 0) {
    pcVar3 = perfetto::base::Basename
                       (
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
    perfetto::base::LogMessage(kLogError,pcVar3,0xe4bb,"UpdateDataSource() must have a non-zero id")
    ;
  }
  else {
    range.second._M_node = (_Base_ptr)0x0;
    __x = protos::gen::DataSourceDescriptor::name_abi_cxx11_(new_desc);
    _it = std::
          multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_perfetto::TracingServiceImpl::RegisteredDataSource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_perfetto::TracingServiceImpl::RegisteredDataSource>_>_>
          ::equal_range(&this->data_sources_,__x);
    local_40._M_node = it._M_node;
    while (bVar1 = std::operator!=(&local_40,&range.first), bVar1) {
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_perfetto::TracingServiceImpl::RegisteredDataSource>_>
               ::operator->(&local_40);
      if ((ppVar4->second).producer_id == producer_id) {
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_perfetto::TracingServiceImpl::RegisteredDataSource>_>
                 ::operator->(&local_40);
        uVar2 = protos::gen::DataSourceDescriptor::id(&(ppVar4->second).descriptor);
        uVar5 = protos::gen::DataSourceDescriptor::id(new_desc);
        if (uVar2 == uVar5) {
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_perfetto::TracingServiceImpl::RegisteredDataSource>_>
                   ::operator->(&local_40);
          range.second._M_node = (_Base_ptr)&ppVar4->second;
          break;
        }
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_perfetto::TracingServiceImpl::RegisteredDataSource>_>
      ::operator++(&local_40);
    }
    if (range.second._M_node == (_Base_ptr)0x0) {
      pcVar3 = perfetto::base::Basename
                         (
                         "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                         );
      protos::gen::DataSourceDescriptor::name_abi_cxx11_(new_desc);
      uVar6 = ::std::__cxx11::string::c_str();
      uVar2 = protos::gen::DataSourceDescriptor::id(new_desc);
      perfetto::base::LogMessage
                (kLogError,pcVar3,0xe4cf,
                 "UpdateDataSource() failed, could not find an existing data source with name=\"%s\" id=%lu"
                 ,uVar6,uVar2);
    }
    else {
      protos::gen::DataSourceDescriptor::operator=
                ((DataSourceDescriptor *)&(range.second._M_node)->_M_parent,new_desc);
    }
  }
  return;
}

Assistant:

void TracingServiceImpl::UpdateDataSource(
    ProducerID producer_id,
    const DataSourceDescriptor& new_desc) {
  if (new_desc.id() == 0) {
    PERFETTO_ELOG("UpdateDataSource() must have a non-zero id");
    return;
  }

  // If this producer has already registered a matching descriptor name and id,
  // just update the descriptor.
  RegisteredDataSource* data_source = nullptr;
  auto range = data_sources_.equal_range(new_desc.name());
  for (auto it = range.first; it != range.second; ++it) {
    if (it->second.producer_id == producer_id &&
        it->second.descriptor.id() == new_desc.id()) {
      data_source = &it->second;
      break;
    }
  }

  if (!data_source) {
    PERFETTO_ELOG(
        "UpdateDataSource() failed, could not find an existing data source "
        "with name=\"%s\" id=%" PRIu64,
        new_desc.name().c_str(), new_desc.id());
    return;
  }

  data_source->descriptor = new_desc;
}